

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O0

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
::complete_store_message_to_queue
          (mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
           *this,deliver_op_tracer *tracer,type_index *msg_type,message_ref_t *message,
          invocation_type_t demand_type)

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  intrusive_ptr_t<so_5::message_t> local_58;
  type_index local_50;
  demand_t local_48;
  byte local_2d;
  invocation_type_t local_2c;
  bool was_empty;
  message_ref_t *pmStack_28;
  invocation_type_t demand_type_local;
  message_ref_t *message_local;
  type_index *msg_type_local;
  deliver_op_tracer *tracer_local;
  mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>
  *this_local;
  
  local_2c = demand_type;
  pmStack_28 = message;
  message_local = (message_ref_t *)msg_type;
  msg_type_local = (type_index *)tracer;
  tracer_local = (deliver_op_tracer *)this;
  local_2d = details::limited_preallocated_demand_queue::is_empty(&this->m_queue);
  local_50._M_target = (type_info *)message_local->m_obj;
  intrusive_ptr_t<so_5::message_t>::intrusive_ptr_t(&local_58,pmStack_28);
  mchain_props::demand_t::demand_t(&local_48,local_50,&local_58,local_2c);
  details::limited_preallocated_demand_queue::push_back(&this->m_queue,&local_48);
  mchain_props::demand_t::~demand_t(&local_48);
  intrusive_ptr_t<so_5::message_t>::~intrusive_ptr_t(&local_58);
  so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer::
  stored<so_5::mchain_props::details::limited_preallocated_demand_queue>
            ((deliver_op_tracer *)msg_type_local,&this->m_queue);
  if ((local_2d & 1) != 0) {
    bVar2 = std::function::operator_cast_to_bool((function *)&this->m_not_empty_notificator);
    if (bVar2) {
      so_5::details::
      invoke_noexcept_code<so_5::mchain_props::mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base>::complete_store_message_to_queue(so_5::impl::msg_tracing_helpers::mchain_tracing_enabled_base::deliver_op_tracer&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&,so_5::invocation_type_t)::_lambda()_1_>
                ((anon_class_8_1_8991fb9c)this);
    }
    notify_multi_chain_select_ops(this);
  }
  if ((this->m_threads_to_wakeup != 0) &&
     (uVar1 = this->m_threads_to_wakeup,
     sVar3 = details::limited_preallocated_demand_queue::size(&this->m_queue), sVar3 <= uVar1)) {
    std::condition_variable::notify_one();
  }
  return;
}

Assistant:

void
		complete_store_message_to_queue(
			typename TRACING_BASE::deliver_op_tracer & tracer,
			const std::type_index & msg_type,
			const message_ref_t & message,
			invocation_type_t demand_type )
			{
				const bool was_empty = m_queue.is_empty();
				
				m_queue.push_back(
						demand_t{ msg_type, message, demand_type } );

				tracer.stored( m_queue );

				// If chain was empty then multi-chain cases must be notified.
				// And if not_empty_notificator is defined then it must be used too.
				if( was_empty )
					{
						if( m_not_empty_notificator )
							so_5::details::invoke_noexcept_code(
								[this] { m_not_empty_notificator(); } );

						notify_multi_chain_select_ops();
					}

				// Should be wake up some sleeping thread?
				if( m_threads_to_wakeup && m_threads_to_wakeup >= m_queue.size() )
					// Someone is waiting on empty queue.
					m_underflow_cond.notify_one();
			}